

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ValidPadding * __thiscall
CoreML::Specification::PoolingLayerParams::mutable_valid(PoolingLayerParams *this)

{
  ValidPadding *this_00;
  
  if (this->_oneof_case_[0] == 0x1e) {
    this_00 = (this->PoolingPaddingType_).valid_;
  }
  else {
    clear_PoolingPaddingType(this);
    this->_oneof_case_[0] = 0x1e;
    this_00 = (ValidPadding *)operator_new(0x20);
    ValidPadding::ValidPadding(this_00);
    (this->PoolingPaddingType_).valid_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::ValidPadding* PoolingLayerParams::mutable_valid() {
  if (!has_valid()) {
    clear_PoolingPaddingType();
    set_has_valid();
    PoolingPaddingType_.valid_ = new ::CoreML::Specification::ValidPadding;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.PoolingLayerParams.valid)
  return PoolingPaddingType_.valid_;
}